

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double find_split_full_gain_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  size_t *psVar4;
  char cVar5;
  ulong *puVar6;
  double *pdVar7;
  size_t sVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  size_t sVar12;
  ulong uVar13;
  double *pdVar14;
  size_t sVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong *puVar32;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar33;
  tuple<> local_b1;
  double local_b0;
  double local_a8;
  double *local_a0;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_98;
  double local_90;
  size_t *local_88;
  double local_80;
  size_t local_78;
  double *local_70;
  float *local_68;
  double local_60;
  ulong *local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  size_t local_38;
  
  if (st < end) {
    if ((ncols_use != 0 && cols_use != (size_t *)0x0) &&
       (auVar28._8_4_ = (int)(ncols_use >> 0x20), auVar28._0_8_ = ncols_use,
       auVar28._12_4_ = 0x45300000, auVar21._8_4_ = (int)(ncols >> 0x20), auVar21._0_8_ = ncols,
       auVar21._12_4_ = 0x45300000,
       ((auVar28._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)ncols_use) - 4503599627370496.0)) /
       ((auVar21._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)ncols) - 4503599627370496.0)) < 0.1)) {
      force_cols_use = true;
    }
    local_70 = (double *)CONCAT71(local_70._1_7_,force_cols_use);
    local_a8 = (double)st;
    local_88 = ix_arr;
    local_78 = ncols_use;
    local_68 = x;
    local_58 = cols_use;
    if (x_uses_ix_arr) {
      local_60 = 0.0;
      if (st <= end) {
        pdVar14 = (double *)(ix_arr + st);
        local_60 = 0.0;
        do {
          local_98._M_head_impl = (unsigned_long *)pdVar14;
          pVar33 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,(unsigned_long *)pdVar14,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_98,(tuple<> *)&local_b0);
          local_60 = local_60 + *(double *)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
          st = st + 1;
          pdVar14 = pdVar14 + 1;
        } while (st <= end);
      }
    }
    else {
      local_60 = 0.0;
      local_b0 = (double)st;
      if (st <= end) {
        local_60 = 0.0;
        do {
          local_98._M_head_impl = (unsigned_long *)&local_b0;
          pVar33 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,(unsigned_long *)&local_b0,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
          local_60 = local_60 + *(double *)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
          local_b0 = (double)((long)local_b0 + 1);
        } while ((ulong)local_b0 <= end);
      }
    }
    cVar5 = (char)local_70;
    sVar8 = ncols;
    if ((char)local_70 != '\0') {
      sVar8 = local_78;
    }
    local_48 = (double)(sVar8 << 3);
    memset(buffer_sum_tot,0,(size_t)local_48);
    puVar6 = local_58;
    sVar8 = local_78;
    local_80 = (double)end;
    if (Xr_indptr == (size_t *)0x0) {
      if (cVar5 == '\0') {
        if (x_uses_ix_arr) {
          dVar22 = local_a8;
          if ((ulong)local_a8 <= end) {
            do {
              local_98._M_head_impl = local_88 + (long)dVar22;
              pVar33 = tsl::detail_robin_hash::
                       robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                       ::
                       insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                 ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                   *)w,local_98._M_head_impl,
                                  (piecewise_construct_t *)&std::piecewise_construct,
                                  (tuple<const_unsigned_long_&> *)&local_98,(tuple<> *)&local_b0);
              if (ncols != 0) {
                sVar8 = local_88[(long)dVar22];
                local_a0 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
                sVar12 = 0;
                do {
                  dVar19 = fma((double)local_a0,X_row_major[sVar8 * ncols + sVar12],
                               buffer_sum_tot[sVar12]);
                  buffer_sum_tot[sVar12] = dVar19;
                  sVar12 = sVar12 + 1;
                } while (ncols != sVar12);
              }
              dVar22 = (double)((long)dVar22 + 1);
            } while ((ulong)dVar22 <= (ulong)local_80);
          }
        }
        else {
          local_b0 = local_a8;
          if ((ulong)local_a8 <= end) {
            do {
              local_98._M_head_impl = (unsigned_long *)&local_b0;
              pVar33 = tsl::detail_robin_hash::
                       robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                       ::
                       insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                 ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                   *)w,(unsigned_long *)&local_b0,
                                  (piecewise_construct_t *)&std::piecewise_construct,
                                  (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
              dVar22 = local_b0;
              if (ncols != 0) {
                sVar8 = local_88[(long)local_b0];
                local_a0 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
                sVar12 = 0;
                do {
                  dVar19 = fma((double)local_a0,X_row_major[sVar8 * ncols + sVar12],
                               buffer_sum_tot[sVar12]);
                  buffer_sum_tot[sVar12] = dVar19;
                  sVar12 = sVar12 + 1;
                } while (ncols != sVar12);
              }
              local_b0 = (double)((long)dVar22 + 1);
            } while ((ulong)local_b0 <= (ulong)local_80);
          }
        }
      }
      else if (x_uses_ix_arr) {
        dVar22 = local_a8;
        if ((ulong)local_a8 <= end) {
          do {
            local_98._M_head_impl = local_88 + (long)dVar22;
            dVar19 = (double)*local_98._M_head_impl;
            local_90 = dVar22;
            pVar33 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_98._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,(tuple<> *)&local_b0);
            if (sVar8 != 0) {
              local_a0 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
              sVar12 = 0;
              do {
                dVar22 = fma((double)local_a0,X_row_major[(long)dVar19 * ncols + puVar6[sVar12]],
                             buffer_sum_tot[sVar12]);
                buffer_sum_tot[sVar12] = dVar22;
                sVar12 = sVar12 + 1;
              } while (sVar8 != sVar12);
            }
            dVar22 = (double)((long)local_90 + 1U);
          } while ((long)local_90 + 1U <= (ulong)local_80);
        }
      }
      else {
        local_b0 = local_a8;
        if ((ulong)local_a8 <= end) {
          do {
            sVar12 = local_88[(long)local_b0];
            local_98._M_head_impl = (unsigned_long *)&local_b0;
            pVar33 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_98._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
            puVar6 = local_58;
            if (sVar8 != 0) {
              local_a0 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
              sVar15 = 0;
              do {
                dVar22 = fma((double)local_a0,X_row_major[sVar12 * ncols + puVar6[sVar15]],
                             buffer_sum_tot[sVar15]);
                buffer_sum_tot[sVar15] = dVar22;
                sVar15 = sVar15 + 1;
              } while (sVar8 != sVar15);
            }
            local_b0 = (double)((long)local_b0 + 1);
          } while ((ulong)local_b0 <= (ulong)local_80);
        }
      }
    }
    else if (cVar5 == '\0') {
      if (x_uses_ix_arr) {
        dVar22 = local_a8;
        if ((ulong)local_a8 <= end) {
          do {
            pdVar14 = (double *)(local_88 + (long)dVar22);
            sVar8 = Xr_indptr[(long)*pdVar14];
            local_98._M_head_impl = (unsigned_long *)pdVar14;
            local_90 = dVar22;
            pVar33 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,(unsigned_long *)pdVar14,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,(tuple<> *)&local_b0);
            sVar12 = Xr_indptr[(long)*pdVar14 + 1];
            if (sVar12 != sVar8) {
              local_a0 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
              do {
                sVar15 = Xr_ind[sVar8];
                dVar22 = fma((double)local_a0,Xr[sVar8],buffer_sum_tot[sVar15]);
                buffer_sum_tot[sVar15] = dVar22;
                sVar8 = sVar8 + 1;
              } while (sVar12 != sVar8);
            }
            dVar22 = (double)((long)local_90 + 1U);
          } while ((long)local_90 + 1U <= (ulong)local_80);
        }
      }
      else {
        local_b0 = local_a8;
        if ((ulong)local_a8 <= end) {
          do {
            psVar4 = local_88;
            sVar8 = Xr_indptr[local_88[(long)local_b0]];
            local_98._M_head_impl = (unsigned_long *)&local_b0;
            pVar33 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_98._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
            local_90 = local_b0;
            sVar12 = Xr_indptr[psVar4[(long)local_b0] + 1];
            if (sVar12 != sVar8) {
              local_a0 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
              do {
                sVar15 = Xr_ind[sVar8];
                dVar22 = fma((double)local_a0,Xr[sVar8],buffer_sum_tot[sVar15]);
                buffer_sum_tot[sVar15] = dVar22;
                sVar8 = sVar8 + 1;
              } while (sVar12 != sVar8);
            }
            local_b0 = (double)((long)local_90 + 1);
          } while ((ulong)local_b0 <= (ulong)local_80);
        }
      }
    }
    else {
      local_b0 = local_a8;
      if ((ulong)local_a8 <= end) {
        puVar6 = local_58 + local_78;
        do {
          sVar8 = Xr_indptr[local_88[(long)local_b0]];
          sVar12 = Xr_indptr[local_88[(long)local_b0] + 1];
          if (sVar8 != sVar12) {
            local_98._M_head_impl = local_88 + (long)local_b0;
            if (!x_uses_ix_arr) {
              local_98._M_head_impl = (unsigned_long *)&local_b0;
            }
            pVar33 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_98._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
            if ((0 < (long)local_78) && ((long)sVar8 < (long)sVar12)) {
              puVar32 = Xr_ind + sVar12;
              local_a0 = Xr + sVar8;
              local_90 = *(double *)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
              puVar11 = Xr_ind + sVar8;
              puVar10 = local_58;
              do {
                uVar2 = *puVar11;
                uVar3 = *puVar10;
                if (uVar2 == uVar3) {
                  lVar16 = (long)puVar10 - (long)local_58;
                  dVar22 = fma(local_90,*(double *)
                                         ((long)local_a0 + ((long)puVar32 - (long)puVar11)),
                               *(double *)((long)buffer_sum_tot + lVar16));
                  *(double *)((long)buffer_sum_tot + lVar16) = dVar22;
                  puVar10 = puVar10 + 1;
                  puVar11 = puVar11 + 1;
                }
                else if (uVar3 < uVar2) {
                  uVar3 = (long)puVar6 - (long)puVar10 >> 3;
                  while (0 < (long)uVar3) {
                    uVar9 = uVar3 >> 1;
                    uVar13 = ~uVar9 + uVar3;
                    uVar3 = uVar9;
                    if (puVar10[uVar9] < uVar2) {
                      uVar3 = uVar13;
                      puVar10 = puVar10 + uVar9 + 1;
                    }
                  }
                }
                else {
                  uVar2 = (long)puVar32 - (long)puVar11 >> 3;
                  while (0 < (long)uVar2) {
                    uVar9 = uVar2 >> 1;
                    uVar13 = ~uVar9 + uVar2;
                    uVar2 = uVar9;
                    if ((puVar11 + uVar9 + 1)[-1] < uVar3) {
                      uVar2 = uVar13;
                      puVar11 = puVar11 + uVar9 + 1;
                    }
                  }
                }
              } while ((puVar10 < puVar6) && (puVar11 < puVar32));
            }
          }
          local_b0 = (double)((long)local_b0 + 1);
        } while ((ulong)local_b0 <= (ulong)local_80);
      }
    }
    dVar22 = local_80;
    memset(buffer_sum_left,0,(size_t)local_48);
    local_b0 = local_a8;
    puVar6 = local_58;
    if (Xr_indptr == (size_t *)0x0) {
      if ((char)local_70 == '\0') {
        local_90 = -INFINITY;
        if ((ulong)local_a8 < (ulong)dVar22) {
          puVar32 = (ulong *)0x0;
          uStack_50 = 0;
          do {
            psVar4 = local_88;
            local_98._M_head_impl = local_88 + (long)local_b0;
            if (!x_uses_ix_arr) {
              local_98._M_head_impl = (unsigned_long *)&local_b0;
            }
            local_58 = puVar32;
            pVar33 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_98._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
            dVar22 = local_b0;
            sVar8 = psVar4[(long)local_b0];
            pdVar14 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
            if (ncols != 0) {
              sVar12 = 0;
              local_a0 = pdVar14;
              do {
                dVar19 = fma((double)local_a0,X_row_major[sVar8 * ncols + sVar12],
                             buffer_sum_left[sVar12]);
                buffer_sum_left[sVar12] = dVar19;
                sVar12 = sVar12 + 1;
                pdVar14 = local_a0;
              } while (ncols != sVar12);
            }
            puVar32 = (ulong *)((double)local_58 + (double)pdVar14);
            if (x_uses_ix_arr) {
              bVar17 = NAN(local_68[sVar8]) || NAN(local_68[local_88[(long)dVar22 + 1]]);
              bVar18 = local_68[sVar8] == local_68[local_88[(long)dVar22 + 1]];
            }
            else {
              bVar17 = NAN(local_68[(long)dVar22]) || NAN(local_68[(long)dVar22 + 1]);
              bVar18 = local_68[(long)dVar22] == local_68[(long)dVar22 + 1];
            }
            if ((!bVar18) || (bVar17)) {
              if (ncols == 0) {
                dVar19 = 0.0;
              }
              else {
                auVar26._0_8_ = local_60 - (double)puVar32;
                auVar26._8_8_ = puVar32;
                dVar20 = 0.0;
                dVar19 = 0.0;
                sVar8 = 0;
                do {
                  dVar1 = buffer_sum_left[sVar8];
                  auVar31._8_8_ = dVar1;
                  auVar31._0_8_ = buffer_sum_tot[sVar8] - dVar1;
                  auVar28 = divpd(auVar31,auVar26);
                  dVar20 = dVar20 + auVar28._0_8_ * (buffer_sum_tot[sVar8] - dVar1);
                  dVar19 = dVar19 + auVar28._8_8_ * dVar1;
                  sVar8 = sVar8 + 1;
                } while (ncols != sVar8);
                dVar19 = dVar19 + dVar20;
              }
              if (local_90 < dVar19) {
                *split_ix = (size_t)dVar22;
                local_90 = dVar19;
              }
            }
            local_b0 = (double)((long)dVar22 + 1);
            puVar6 = local_58;
          } while ((ulong)local_b0 < (ulong)local_80);
        }
      }
      else {
        local_90 = -INFINITY;
        if ((ulong)local_a8 < (ulong)dVar22) {
          dVar22 = 0.0;
          uStack_40 = 0;
          do {
            sVar8 = local_78;
            psVar4 = local_88;
            local_98._M_head_impl = local_88 + (long)local_b0;
            if (!x_uses_ix_arr) {
              local_98._M_head_impl = (unsigned_long *)&local_b0;
            }
            local_48 = dVar22;
            pVar33 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_98._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
            puVar6 = local_58;
            local_a8 = local_b0;
            local_70 = (double *)psVar4[(long)local_b0];
            pdVar14 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
            if (sVar8 != 0) {
              lVar16 = (long)local_70 * ncols;
              sVar12 = 0;
              local_a0 = pdVar14;
              do {
                dVar22 = fma((double)local_a0,X_row_major[lVar16 + puVar6[sVar12]],
                             buffer_sum_left[sVar12]);
                buffer_sum_left[sVar12] = dVar22;
                sVar12 = sVar12 + 1;
                pdVar14 = local_a0;
              } while (sVar8 != sVar12);
            }
            dVar22 = local_48 + (double)pdVar14;
            if (x_uses_ix_arr) {
              bVar17 = NAN(local_68[(long)local_70]) || NAN(local_68[local_88[(long)local_a8 + 1]]);
              bVar18 = local_68[(long)local_70] == local_68[local_88[(long)local_a8 + 1]];
            }
            else {
              bVar17 = NAN(local_68[(long)local_a8]) || NAN(local_68[(long)local_a8 + 1]);
              bVar18 = local_68[(long)local_a8] == local_68[(long)local_a8 + 1];
            }
            if ((!bVar18) || (bVar17)) {
              if (local_78 == 0) {
                dVar19 = 0.0;
              }
              else {
                auVar24._0_8_ = local_60 - dVar22;
                auVar24._8_8_ = dVar22;
                dVar20 = 0.0;
                dVar19 = 0.0;
                sVar8 = 0;
                do {
                  dVar1 = buffer_sum_left[sVar8];
                  auVar29._8_8_ = dVar1;
                  auVar29._0_8_ = buffer_sum_tot[sVar8] - dVar1;
                  auVar28 = divpd(auVar29,auVar24);
                  dVar20 = dVar20 + auVar28._0_8_ * (buffer_sum_tot[sVar8] - dVar1);
                  dVar19 = dVar19 + auVar28._8_8_ * dVar1;
                  sVar8 = sVar8 + 1;
                } while (local_78 != sVar8);
                dVar19 = dVar19 + dVar20;
              }
              if (local_90 < dVar19) {
                *split_ix = (size_t)local_a8;
                local_90 = dVar19;
              }
            }
            local_b0 = (double)((long)local_a8 + 1);
            puVar6 = local_58;
          } while ((ulong)local_b0 < (ulong)local_80);
        }
      }
    }
    else if ((char)local_70 == '\0') {
      local_90 = -INFINITY;
      if ((ulong)local_a8 < (ulong)dVar22) {
        local_58 = (ulong *)0x0;
        uStack_50 = 0;
        do {
          psVar4 = local_88;
          local_98._M_head_impl = local_88 + (long)local_b0;
          if (!x_uses_ix_arr) {
            local_98._M_head_impl = (unsigned_long *)&local_b0;
          }
          pVar33 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,local_98._M_head_impl,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
          local_70 = (double *)psVar4[(long)local_b0];
          sVar12 = Xr_indptr[(long)local_70 + 1];
          pdVar7 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
          local_a8 = local_b0;
          pdVar14 = local_a0;
          puVar6 = local_58;
          for (sVar8 = Xr_indptr[(long)local_70]; local_a0 = pdVar7, sVar12 != sVar8;
              sVar8 = sVar8 + 1) {
            sVar15 = Xr_ind[sVar8];
            local_58 = puVar6;
            dVar22 = fma((double)local_a0,Xr[sVar8],buffer_sum_left[sVar15]);
            buffer_sum_left[sVar15] = dVar22;
            pdVar7 = local_a0;
            pdVar14 = local_a0;
            puVar6 = local_58;
          }
          local_58 = (ulong *)((double)puVar6 + (double)local_a0);
          if (x_uses_ix_arr) {
            bVar17 = NAN(local_68[(long)local_70]) || NAN(local_68[local_88[(long)local_a8 + 1]]);
            bVar18 = local_68[(long)local_70] == local_68[local_88[(long)local_a8 + 1]];
          }
          else {
            bVar17 = NAN(local_68[(long)local_a8]) || NAN(local_68[(long)local_a8 + 1]);
            bVar18 = local_68[(long)local_a8] == local_68[(long)local_a8 + 1];
          }
          if ((!bVar18) || (bVar17)) {
            if (ncols == 0) {
              dVar22 = 0.0;
            }
            else {
              auVar25._0_8_ = local_60 - (double)local_58;
              auVar25._8_8_ = local_58;
              dVar19 = 0.0;
              dVar22 = 0.0;
              sVar8 = 0;
              do {
                dVar20 = buffer_sum_left[sVar8];
                auVar30._8_8_ = dVar20;
                auVar30._0_8_ = buffer_sum_tot[sVar8] - dVar20;
                auVar28 = divpd(auVar30,auVar25);
                dVar19 = dVar19 + auVar28._0_8_ * (buffer_sum_tot[sVar8] - dVar20);
                dVar22 = dVar22 + auVar28._8_8_ * dVar20;
                sVar8 = sVar8 + 1;
              } while (ncols != sVar8);
              dVar22 = dVar22 + dVar19;
            }
            if (local_90 < dVar22) {
              *split_ix = (size_t)local_a8;
              local_90 = dVar22;
            }
          }
          local_b0 = (double)((long)local_a8 + 1);
          local_a0 = pdVar14;
        } while ((ulong)local_b0 < (ulong)local_80);
      }
    }
    else if ((ulong)local_a8 < (ulong)dVar22) {
      puVar32 = local_58 + local_78;
      local_90 = -INFINITY;
      local_48 = 0.0;
      uStack_40 = 0;
      do {
        psVar4 = local_88;
        local_98._M_head_impl = local_88 + (long)local_b0;
        if (!x_uses_ix_arr) {
          local_98._M_head_impl = (unsigned_long *)&local_b0;
        }
        pVar33 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,local_98._M_head_impl,
                            (piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
        local_a0 = *(double **)((pVar33.first.m_bucket.m_bucket)->m_value + 8);
        local_a8 = local_b0;
        local_38 = psVar4[(long)local_b0];
        sVar8 = Xr_indptr[local_38];
        sVar12 = Xr_indptr[local_38 + 1];
        if (((sVar8 != sVar12) && (0 < (long)local_78)) && ((long)sVar8 < (long)sVar12)) {
          puVar6 = Xr_ind + sVar12;
          local_70 = Xr + sVar8;
          puVar11 = Xr_ind + sVar8;
          puVar10 = local_58;
          do {
            uVar2 = *puVar11;
            uVar3 = *puVar10;
            if (uVar2 == uVar3) {
              lVar16 = (long)puVar10 - (long)local_58;
              dVar22 = fma((double)local_a0,
                           *(double *)((long)local_70 + ((long)puVar6 - (long)puVar11)),
                           *(double *)((long)buffer_sum_left + lVar16));
              *(double *)((long)buffer_sum_left + lVar16) = dVar22;
              puVar10 = puVar10 + 1;
              puVar11 = puVar11 + 1;
            }
            else if (uVar3 < uVar2) {
              uVar3 = (long)puVar32 - (long)puVar10 >> 3;
              while (0 < (long)uVar3) {
                uVar9 = uVar3 >> 1;
                uVar13 = ~uVar9 + uVar3;
                uVar3 = uVar9;
                if (puVar10[uVar9] < uVar2) {
                  uVar3 = uVar13;
                  puVar10 = puVar10 + uVar9 + 1;
                }
              }
            }
            else {
              uVar2 = (long)puVar6 - (long)puVar11 >> 3;
              while (0 < (long)uVar2) {
                uVar9 = uVar2 >> 1;
                uVar13 = ~uVar9 + uVar2;
                uVar2 = uVar9;
                if ((puVar11 + uVar9 + 1)[-1] < uVar3) {
                  uVar2 = uVar13;
                  puVar11 = puVar11 + uVar9 + 1;
                }
              }
            }
          } while ((puVar10 < puVar32) && (puVar11 < puVar6));
        }
        local_48 = local_48 + (double)local_a0;
        if (x_uses_ix_arr) {
          bVar17 = NAN(local_68[local_38]) || NAN(local_68[local_88[(long)local_a8 + 1]]);
          bVar18 = local_68[local_38] == local_68[local_88[(long)local_a8 + 1]];
        }
        else {
          bVar17 = NAN(local_68[(long)local_a8]) || NAN(local_68[(long)local_a8 + 1]);
          bVar18 = local_68[(long)local_a8] == local_68[(long)local_a8 + 1];
        }
        if ((!bVar18) || (bVar17)) {
          if (local_78 == 0) {
            dVar22 = 0.0;
          }
          else {
            auVar23._0_8_ = local_60 - local_48;
            auVar23._8_8_ = local_48;
            dVar19 = 0.0;
            dVar22 = 0.0;
            sVar8 = 0;
            do {
              dVar20 = buffer_sum_left[sVar8];
              auVar27._8_8_ = dVar20;
              auVar27._0_8_ = buffer_sum_tot[sVar8] - dVar20;
              auVar28 = divpd(auVar27,auVar23);
              dVar19 = dVar19 + auVar28._0_8_ * (buffer_sum_tot[sVar8] - dVar20);
              dVar22 = dVar22 + auVar28._8_8_ * dVar20;
              sVar8 = sVar8 + 1;
            } while (local_78 != sVar8);
            dVar22 = dVar22 + dVar19;
          }
          if (local_90 < dVar22) {
            *split_ix = (size_t)local_a8;
            local_90 = dVar22;
          }
        }
        local_b0 = (double)((long)local_a8 + 1);
        puVar6 = local_58;
      } while ((ulong)local_b0 < (ulong)local_80);
    }
    else {
      local_90 = -INFINITY;
    }
    local_58 = puVar6;
    if (-INFINITY < local_90) {
      dVar22 = midpoint<float>(local_68[local_88[*split_ix]],local_68[local_88[*split_ix + 1]]);
      *split_point = dVar22;
      local_90 = local_90 / local_60;
    }
  }
  else {
    local_90 = -INFINITY;
  }
  return local_90;
}

Assistant:

double find_split_full_gain_weighted(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                                     size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                     double *restrict X_row_major, size_t ncols,
                                     double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                     double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                                     size_t &restrict split_ix, double &restrict split_point,
                                     bool x_uses_ix_arr,
                                     mapping &restrict w)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    double wtot = 0;
    if (x_uses_ix_arr)
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[ix_arr[row]];
    }

    else
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[row];
    }

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[ix_arr[row]], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[row], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;

            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[ix_arr[row]];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[row];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[ix_arr[row]], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[row], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                size_t dtemp;
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_tot[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_tot[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double vleft, vright;
    double wleft = 0;
    double w_row;
    double wright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                axpy1(w_row, X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;

                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_left[col]);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row= w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                ptr_this = Xr_indptr[ix_arr[row]];
                axpy1(w_row, Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            size_t dtemp;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_left[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_left[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain  <= -HUGE_VAL) return best_gain;
    
    split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    return best_gain / wtot;
}